

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O0

void __thiscall kj::TopLevelProcessContext::exit(TopLevelProcessContext *this,int __status)

{
  uint *puVar1;
  uint __status_00;
  int exitCode;
  TopLevelProcessContext *this_local;
  
  __status_00 = (uint)((this->hadErrors & 1U) != 0);
  if ((this->cleanShutdown & 1U) != 0) {
    puVar1 = (uint *)__cxa_allocate_exception(4);
    *puVar1 = __status_00;
    __cxa_throw(puVar1,&CleanShutdownException::typeinfo,0);
  }
  _exit(__status_00);
}

Assistant:

void TopLevelProcessContext::exit() {
  int exitCode = hadErrors ? 1 : 0;
  if (cleanShutdown) {
#if KJ_NO_EXCEPTIONS
    // This is the best we can do.
    warning("warning: KJ_CLEAN_SHUTDOWN may not work correctly when compiled "
            "with -fno-exceptions.");
    ::exit(exitCode);
#else
    throw CleanShutdownException { exitCode };
#endif
  }
  _exit(exitCode);
}